

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
               *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = this->_has_bits_[0];
  if ((uVar1 & 1) == 0) {
    lVar5 = 0;
  }
  else {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    sVar3 = WireFormatLite::StringSize((string *)CONCAT44(extraout_var,iVar2));
    lVar5 = (long)(int)sVar3 + 1;
    uVar1 = this->_has_bits_[0];
  }
  if ((uVar1 & 2) == 0) {
    lVar4 = 0;
  }
  else {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    sVar3 = WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
                      ((CustomLayerParams_CustomLayerParamValue *)CONCAT44(extraout_var_00,iVar2));
    lVar4 = sVar3 + 1;
  }
  return lVar4 + lVar5;
}

Assistant:

size_t ByteSizeLong() const {
    size_t size = 0;
    size += has_key() ? kTagSize + KeyTypeHandler::ByteSize(key()) : 0;
    size += has_value() ? kTagSize + ValueTypeHandler::ByteSize(value()) : 0;
    return size;
  }